

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_allocator.c
# Opt level: O0

void * metacall_allocator_create(metacall_allocator_id allocator_id,void *ctx)

{
  memory_allocator_nginx_impl_pfree in_RSI;
  int in_EDI;
  void *unaff_retaddr;
  metacall_allocator_nginx nginx_ctx;
  metacall_allocator_std std_ctx;
  uint in_stack_fffffffffffffff0;
  memory_allocator_nginx_impl_palloc in_stack_fffffffffffffff8;
  memory_allocator pmVar1;
  
  if (in_EDI == 0) {
    pmVar1 = memory_allocator_std
                       ((memory_allocator_std_impl_malloc)(ulong)in_stack_fffffffffffffff0,
                        (memory_allocator_std_impl_realloc)in_RSI,
                        (memory_allocator_std_impl_free)in_RSI);
  }
  else if (in_EDI == 1) {
    pmVar1 = memory_allocator_nginx
                       (unaff_retaddr,in_stack_fffffffffffffff8,
                        (memory_allocator_nginx_impl_pcopy)CONCAT44(1,in_stack_fffffffffffffff0),
                        in_RSI);
  }
  else {
    pmVar1 = (memory_allocator)0x0;
  }
  return pmVar1;
}

Assistant:

void *metacall_allocator_create(enum metacall_allocator_id allocator_id, void *ctx)
{
	switch (allocator_id)
	{
		case METACALL_ALLOCATOR_STD: {
			metacall_allocator_std std_ctx = (metacall_allocator_std)ctx;

			return memory_allocator_std(std_ctx->malloc, std_ctx->realloc, std_ctx->free);
		}

		case METACALL_ALLOCATOR_NGINX: {
			metacall_allocator_nginx nginx_ctx = (metacall_allocator_nginx)ctx;

			return memory_allocator_nginx((void *)nginx_ctx->pool,
				(memory_allocator_nginx_impl_palloc)nginx_ctx->palloc,
				(memory_allocator_nginx_impl_pcopy)nginx_ctx->pcopy,
				(memory_allocator_nginx_impl_pfree)nginx_ctx->pfree);
		}
	}

	return NULL;
}